

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSAPrivateKey.cpp
# Opt level: O3

ByteString * __thiscall
RSAPrivateKey::serialise(ByteString *__return_storage_ptr__,RSAPrivateKey *this)

{
  ByteString local_240;
  ByteString local_218;
  ByteString local_1f0;
  ByteString local_1c8;
  ByteString local_1a0;
  ByteString local_178;
  ByteString local_150;
  ByteString local_128;
  ByteString local_100;
  ByteString local_d8;
  ByteString local_b0;
  ByteString local_88;
  ByteString local_60;
  ByteString local_38;
  
  ByteString::serialise(&local_128,&this->p);
  ByteString::serialise(&local_150,&this->q);
  operator+(&local_100,&local_128,&local_150);
  ByteString::serialise(&local_178,&this->pq);
  operator+(&local_d8,&local_100,&local_178);
  ByteString::serialise(&local_1a0,&this->dp1);
  operator+(&local_b0,&local_d8,&local_1a0);
  ByteString::serialise(&local_1c8,&this->dq1);
  operator+(&local_88,&local_b0,&local_1c8);
  ByteString::serialise(&local_1f0,&this->d);
  operator+(&local_60,&local_88,&local_1f0);
  ByteString::serialise(&local_218,&this->n);
  operator+(&local_38,&local_60,&local_218);
  ByteString::serialise(&local_240,&this->e);
  operator+(__return_storage_ptr__,&local_38,&local_240);
  local_240._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_240.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  local_38._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_38.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_218._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_218.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  local_60._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_60.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_1f0._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_1f0.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  local_88._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_88.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_1c8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_1c8.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  local_b0._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_b0.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_1a0._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_1a0.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  local_d8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_d8.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_178._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_178.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  local_100._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_100.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  local_150._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_150.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  local_128._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_128.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

ByteString RSAPrivateKey::serialise() const
{
	return p.serialise() +
	       q.serialise() +
	       pq.serialise() +
	       dp1.serialise() +
	       dq1.serialise() +
	       d.serialise() +
	       n.serialise() +
	       e.serialise();
}